

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::Parser::LocationRecorder::Init
          (LocationRecorder *this,LocationRecorder *parent)

{
  int iVar1;
  int iVar2;
  ColumnNumber CVar3;
  Parser *pPVar4;
  Type *pTVar5;
  Location *pLVar6;
  Type *pTVar7;
  
  pPVar4 = parent->parser_;
  this->parser_ = pPVar4;
  pTVar7 = internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<google::protobuf::SourceCodeInfo_Location>::TypeHandler>
                     (&(pPVar4->source_code_info_->location_).super_RepeatedPtrFieldBase,(Type *)0x0
                     );
  this->location_ = pTVar7;
  pTVar5 = parent->location_;
  if (pTVar5 != pTVar7) {
    (pTVar7->path_).current_size_ = 0;
    iVar1 = (pTVar5->path_).current_size_;
    if (iVar1 != 0) {
      RepeatedField<int>::Reserve(&pTVar7->path_,iVar1);
      memcpy(((pTVar7->path_).rep_)->elements + (pTVar7->path_).current_size_,
             ((pTVar5->path_).rep_)->elements,(long)(pTVar5->path_).current_size_ << 2);
      (pTVar7->path_).current_size_ = (pTVar7->path_).current_size_ + (pTVar5->path_).current_size_;
    }
  }
  pLVar6 = this->location_;
  iVar1 = (this->parser_->input_->current_).line;
  iVar2 = (pLVar6->span_).total_size_;
  if ((pLVar6->span_).current_size_ == iVar2) {
    RepeatedField<int>::Reserve(&pLVar6->span_,iVar2 + 1);
  }
  iVar2 = (pLVar6->span_).current_size_;
  (pLVar6->span_).current_size_ = iVar2 + 1;
  ((pLVar6->span_).rep_)->elements[iVar2] = iVar1;
  pLVar6 = this->location_;
  CVar3 = (this->parser_->input_->current_).column;
  iVar1 = (pLVar6->span_).total_size_;
  if ((pLVar6->span_).current_size_ == iVar1) {
    RepeatedField<int>::Reserve(&pLVar6->span_,iVar1 + 1);
  }
  iVar1 = (pLVar6->span_).current_size_;
  (pLVar6->span_).current_size_ = iVar1 + 1;
  ((pLVar6->span_).rep_)->elements[iVar1] = CVar3;
  return;
}

Assistant:

void Parser::LocationRecorder::Init(const LocationRecorder& parent) {
  parser_ = parent.parser_;
  location_ = parser_->source_code_info_->add_location();
  location_->mutable_path()->CopyFrom(parent.location_->path());

  location_->add_span(parser_->input_->current().line);
  location_->add_span(parser_->input_->current().column);
}